

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O0

void __thiscall
phmap::priv::btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
::internal_clear(btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                 *this,node_type *node)

{
  bool bVar1;
  byte bVar2;
  btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
  *node_00;
  undefined4 local_1c;
  int i;
  node_type *node_local;
  btree<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_> *this_local
  ;
  
  bVar1 = btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
          ::leaf(node);
  if (bVar1) {
    delete_leaf_node(this,node);
  }
  else {
    local_1c = 0;
    while( true ) {
      bVar2 = btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
              ::count(node);
      if ((int)(uint)bVar2 < local_1c) break;
      node_00 = btree_node<phmap::priv::set_params<int,_phmap::Less<int>,_std::allocator<int>,_256,_true>_>
                ::child(node,(long)local_1c);
      internal_clear(this,node_00);
      local_1c = local_1c + 1;
    }
    delete_internal_node(this,node);
  }
  return;
}

Assistant:

void btree<P>::internal_clear(node_type *node) {
        if (!node->leaf()) {
            for (int i = 0; i <= node->count(); ++i) {
                internal_clear(node->child(i));
            }
            delete_internal_node(node);
        } else {
            delete_leaf_node(node);
        }
    }